

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  undefined8 uVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  char *pcVar5;
  pointer ppTVar6;
  testing *this_00;
  char *in_R8;
  string local_80;
  size_type *local_60;
  string f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  local_60 = &f._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,FLAGS_gtest_filter_abi_cxx11_,
             DAT_0014e618 + FLAGS_gtest_filter_abi_cxx11_);
  if (((local_60 == (size_type *)0x0) || ((char)*local_60 != '*')) ||
     (*(char *)((long)local_60 + 1) != '\0')) {
    ColoredPrintf(kYellow,"Note: %s filter = %s\n","Google Test");
  }
  bVar2 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar2) {
    iVar3 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    pcVar5 = getenv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(kYellow,"Note: This is test shard %d of %s.\n",(ulong)(iVar3 + 1),pcVar5);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    ColoredPrintf(kYellow,"Note: Randomizing tests\' orders with a seed of %d .\n",
                  (ulong)(uint)unit_test->impl_->random_seed_);
  }
  ColoredPrintf(kGreen,"[==========] ");
  uVar4 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_
            ((string *)((long)&f.field_2 + 8),(testing *)(ulong)uVar4,0x13d31f,"tests",in_R8);
  uVar1 = f.field_2._8_8_;
  this_00 = (testing *)0x0;
  for (ppTVar6 = (unit_test->impl_->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar6 !=
      (unit_test->impl_->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
    this_00 = (testing *)(ulong)((int)this_00 + (uint)(*ppTVar6)->should_run_);
  }
  FormatCountableNoun_abi_cxx11_(&local_80,this_00,0x13c2ee,"test suites",in_R8);
  printf("Running %s from %s.\n",uVar1,local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)f.field_2._8_8_ != &local_30) {
    operator_delete((void *)f.field_2._8_8_,local_30._M_allocated_capacity + 1);
  }
  fflush(_stdout);
  if (local_60 != &f._M_string_length) {
    operator_delete(local_60,f._M_string_length + 1);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG_GET(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  std::string f = GTEST_FLAG_GET(filter);
  const char* const filter = f.c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(GTestColor::kYellow, "Note: %s filter = %s\n", GTEST_NAME_,
                  filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const int32_t shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(GTestColor::kYellow, "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG_GET(shuffle)) {
    ColoredPrintf(GTestColor::kYellow,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}